

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

void * QTest::fetchData(QTestData *data,char *tagName,int typeId)

{
  int iVar1;
  int iVar2;
  QTestTable *pQVar3;
  void *pvVar4;
  char *pcVar5;
  int unaff_R14D;
  char *pcVar6;
  long in_FS_OFFSET;
  QMetaType local_58;
  QMetaType local_50;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (typeId == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0012ef56;
    fetchData();
LAB_0012ef2c:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0012ef56;
    fetchData();
  }
  else {
    if (data == (QTestData *)0x0) goto LAB_0012ef2c;
    pQVar3 = QTestData::parent(data);
    if (pQVar3 != (QTestTable *)0x0) {
      pQVar3 = QTestData::parent(data);
      iVar1 = QTestTable::indexOf(pQVar3,tagName);
      if (iVar1 != -1) {
        iVar2 = QTestData::dataCount(data);
        unaff_R14D = iVar1;
        if (iVar1 < iVar2) {
          pQVar3 = QTestData::parent(data);
          iVar2 = QTestTable::elementTypeId(pQVar3,iVar1);
          if (iVar2 == typeId) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              pvVar4 = QTestData::data(data,iVar1);
              return pvVar4;
            }
            goto LAB_0012ef56;
          }
          goto LAB_0012ee8d;
        }
      }
      iVar1 = unaff_R14D;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        fetchData();
LAB_0012ee8d:
        local_48[0] = '\x02';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        local_30 = "default";
        QMetaType::QMetaType(&local_50,typeId);
        if (local_50.d_ptr == (QMetaTypeInterface *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = (local_50.d_ptr)->name;
        }
        pQVar3 = QTestData::parent(data);
        iVar1 = QTestTable::elementTypeId(pQVar3,iVar1);
        QMetaType::QMetaType(&local_58,iVar1);
        if (local_58.d_ptr == (QMetaTypeInterface *)0x0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (local_58.d_ptr)->name;
        }
        QMessageLogger::fatal
                  (local_48,"Requested type \'%s\' does not match available type \'%s\'.",pcVar6,
                   pcVar5);
      }
      goto LAB_0012ef56;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    fetchData();
  }
LAB_0012ef56:
  __stack_chk_fail();
}

Assistant:

void *fetchData(QTestData *data, const char *tagName, int typeId)
{
    QTEST_ASSERT(typeId);
    QTEST_ASSERT_X(data, "QTest::fetchData()", "Test data requested, but no testdata available.");
    QTEST_ASSERT(data->parent());

    int idx = data->parent()->indexOf(tagName);

    if (Q_UNLIKELY(idx == -1 || idx >= data->dataCount())) {
        qFatal("QFETCH: Requested testdata '%s' not available, check your _data function.",
                tagName);
    }

    if (Q_UNLIKELY(typeId != data->parent()->elementTypeId(idx))) {
        qFatal("Requested type '%s' does not match available type '%s'.",
               QMetaType(typeId).name(),
               QMetaType(data->parent()->elementTypeId(idx)).name());
    }

    return data->data(idx);
}